

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Print<char[5],char[11]>
          (Printer *this,string_view text,char (*args) [5],char (*args_1) [11])

{
  basic_string_view<char,_std::char_traits<char>_> *key;
  string_view vars [3];
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  map;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  undefined8 local_88;
  char *local_80;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_78;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_58;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_50;
  _Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_&,_false> local_48;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::iterator,_bool>
  local_40;
  
  local_a8._M_len = strlen(*args);
  local_a8._M_str = *args;
  local_98._M_len = strlen(*args_1);
  local_88 = 0;
  local_80 = anon_var_dwarf_a12c75 + 5;
  local_78.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_78.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_78.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  local_98._M_str = *args_1;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::reserve(&local_78,1);
  local_48._M_head_impl = &local_98;
  local_58 = &local_78;
  local_50._M_head_impl = &local_a8;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>
  ::EmplaceDecomposable::operator()
            (&local_40,&local_58,&local_a8,(piecewise_construct_t *)&std::piecewise_construct,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *)&local_50,
             (tuple<std::basic_string_view<char,_std::char_traits<char>_>_&> *)&local_48);
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::basic_string_view<char,std::char_traits<char>>>>>>
            (this,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)&local_78,text);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::~raw_hash_set(&local_78);
  return;
}

Assistant:

void Printer::Print(absl::string_view text, const Args&... args) {
  static_assert(sizeof...(args) % 2 == 0, "");

  // Include an extra arg, since a zero-length array is ill-formed, and
  // MSVC complains.
  absl::string_view vars[] = {args..., ""};
  absl::flat_hash_map<absl::string_view, absl::string_view> map;
  map.reserve(sizeof...(args) / 2);
  for (size_t i = 0; i < sizeof...(args); i += 2) {
    map.emplace(vars[i], vars[i + 1]);
  }

  Print(map, text);
}